

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void av1_subtract_block(BitDepthInfo bd_info,int rows,int cols,int16_t *diff,ptrdiff_t diff_stride,
                       uint8_t *src8,ptrdiff_t src_stride,uint8_t *pred8,ptrdiff_t pred_stride)

{
  int16_t *in_RCX;
  int in_EDX;
  int in_ESI;
  int16_t *in_RDI;
  ptrdiff_t in_R8;
  uint8_t *in_R9;
  int unaff_retaddr;
  int unaff_retaddr_00;
  ptrdiff_t in_stack_00000008;
  
  if ((int)((ulong)in_RDI >> 0x20) == 0) {
    (*aom_subtract_block)(in_ESI,in_EDX,in_RCX,in_R8,in_R9,in_stack_00000008,src8,diff_stride);
  }
  else {
    aom_highbd_subtract_block_sse2
              (unaff_retaddr_00,unaff_retaddr,in_RDI,CONCAT44(in_ESI,in_EDX),(uint8_t *)in_RCX,in_R8
               ,src8,diff_stride);
  }
  return;
}

Assistant:

void av1_subtract_block(BitDepthInfo bd_info, int rows, int cols, int16_t *diff,
                        ptrdiff_t diff_stride, const uint8_t *src8,
                        ptrdiff_t src_stride, const uint8_t *pred8,
                        ptrdiff_t pred_stride) {
  assert(rows >= 4 && cols >= 4);
#if CONFIG_AV1_HIGHBITDEPTH
  if (bd_info.use_highbitdepth_buf) {
    aom_highbd_subtract_block(rows, cols, diff, diff_stride, src8, src_stride,
                              pred8, pred_stride);
    return;
  }
#endif
  (void)bd_info;
  aom_subtract_block(rows, cols, diff, diff_stride, src8, src_stride, pred8,
                     pred_stride);
}